

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::forward(Buffer *this,off_t offset)

{
  char *__dest;
  char *pcVar1;
  long lVar2;
  size_t __n;
  off_t offset_local;
  Buffer *this_local;
  
  if (offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xa2,"void Liby::Buffer::forward(off_t)");
  }
  if (offset == 0) {
    if (this->leftIndex_ != 0) {
      __dest = this->buffer_;
      pcVar1 = this->buffer_;
      lVar2 = this->leftIndex_;
      __n = size(this);
      memmove(__dest,pcVar1 + lVar2,__n);
      this->rightIndex_ = this->rightIndex_ - this->leftIndex_;
      this->leftIndex_ = 0;
    }
  }
  else if (offset < this->rightIndex_) {
    if (this->leftIndex_ < offset) {
      memmove(this->buffer_,this->buffer_ + (this->rightIndex_ - offset),this->rightIndex_ - offset)
      ;
      this->leftIndex_ = 0;
      this->rightIndex_ = this->rightIndex_ - offset;
    }
    else {
      memmove(this->buffer_ + (this->leftIndex_ - offset),this->buffer_ + this->leftIndex_,
              this->rightIndex_ - this->leftIndex_);
      this->leftIndex_ = this->leftIndex_ - offset;
      this->rightIndex_ = this->rightIndex_ - offset;
    }
  }
  else {
    this->rightIndex_ = 0;
    this->leftIndex_ = 0;
  }
  return;
}

Assistant:

void Buffer::forward(off_t offset) {
    assert(offset >= 0);
    if (offset == 0) {
        if (leftIndex_ == 0) {
            return;
        }
        ::memmove(buffer_, buffer_ + leftIndex_, size());
        rightIndex_ -= leftIndex_;
        leftIndex_ = 0;
    } else if (offset >= rightIndex_) {
        leftIndex_ = rightIndex_ = 0;
    } else if (offset <= leftIndex_) {
        ::memmove(buffer_ + leftIndex_ - offset, buffer_ + leftIndex_,
                  rightIndex_ - leftIndex_);
        leftIndex_ -= offset;
        rightIndex_ -= offset;
    } else {
        ::memmove(buffer_, buffer_ + rightIndex_ - offset,
                  rightIndex_ - offset);
        leftIndex_ = 0;
        rightIndex_ -= offset;
    }
}